

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O1

idx_t __thiscall
duckdb::IntervalToStringCast::Format(IntervalToStringCast *this,interval_t interval,char *buffer)

{
  int iVar1;
  int32_t iVar2;
  unsigned_long uVar3;
  idx_t iVar4;
  char *buffer_00;
  long lVar5;
  long value;
  ulong uVar6;
  char cVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  idx_t local_30;
  
  buffer_00 = (char *)interval.micros;
  lVar10 = interval._0_8_;
  local_30 = 0;
  iVar1 = (int)this;
  if (iVar1 != 0) {
    FormatIntervalValue(iVar1 / 0xc,buffer_00,&local_30," year",5);
    FormatIntervalValue(iVar1 % 0xc,buffer_00,&local_30," month",6);
  }
  if ((ulong)this >> 0x20 != 0) {
    FormatIntervalValue((int32_t)((ulong)this >> 0x20),buffer_00,&local_30," day",4);
  }
  if (lVar10 == 0) {
    iVar4 = local_30;
    if (local_30 == 0) {
      builtin_strncpy(buffer_00,"00:00:00",8);
      iVar4 = 8;
    }
  }
  else {
    if (local_30 != 0) {
      buffer_00[local_30] = ' ';
      local_30 = local_30 + 1;
    }
    if (lVar10 < 0) {
      buffer_00[local_30] = '-';
      local_30 = local_30 + 1;
    }
    else {
      lVar10 = -lVar10;
    }
    lVar5 = SUB168(SEXT816(lVar10) * SEXT816(0x674a40d3fc1ad63b),8) - lVar10;
    value = (lVar5 >> 0x1f) - (lVar5 >> 0x3f);
    lVar5 = value * 3600000000 + lVar10;
    lVar8 = SUB168(SEXT816(lVar5) * SEXT816(0x70d59cc6bc5928d7),8) - lVar5;
    uVar9 = (lVar8 >> 0x19) - (lVar8 >> 0x3f);
    lVar5 = uVar9 * 60000000 + lVar5;
    lVar8 = SUB168(SEXT816(lVar5) * SEXT816(-0x431bde82d7b634db),8);
    if (-36000000000 < lVar10) {
      buffer_00[local_30] = '0';
      local_30 = local_30 + 1;
    }
    uVar6 = (lVar8 >> 0x12) - (lVar8 >> 0x3f);
    FormatSignedNumber(value,buffer_00,&local_30);
    buffer_00[local_30] = ':';
    if ((int)uVar9 < 10) {
      buffer_00[local_30 + 1] = '0';
      cVar7 = (char)uVar9 + '0';
    }
    else {
      buffer_00[local_30 + 1] =
           duckdb_fmt::v6::internal::basic_data<void>::digits[(uVar9 & 0xffffffff) * 2];
      cVar7 = duckdb_fmt::v6::internal::basic_data<void>::digits
              [((uVar9 & 0xffffffff) * 2 & 0xffffffff) + 1];
    }
    buffer_00[local_30 + 2] = cVar7;
    buffer_00[local_30 + 3] = ':';
    if ((int)uVar6 < 10) {
      buffer_00[local_30 + 4] = '0';
      cVar7 = (char)uVar6 + '0';
    }
    else {
      buffer_00[local_30 + 4] =
           duckdb_fmt::v6::internal::basic_data<void>::digits[(uVar6 & 0xffffffff) * 2];
      cVar7 = duckdb_fmt::v6::internal::basic_data<void>::digits
              [((uVar6 & 0xffffffff) * 2 & 0xffffffff) + 1];
    }
    buffer_00[local_30 + 5] = cVar7;
    iVar4 = local_30 + 6;
    if (uVar6 * -1000000 - lVar5 != 0) {
      buffer_00[local_30 + 6] = '.';
      local_30 = local_30 + 7;
      iVar1 = NumericCastImpl<int,_long,_false>::Convert(uVar6 * -1000000 - lVar5);
      iVar2 = TimeToStringCast::FormatMicros(iVar1,buffer_00 + local_30);
      uVar3 = NumericCastImpl<unsigned_long,_int,_false>::Convert(6 - iVar2);
      iVar4 = local_30 + uVar3;
    }
  }
  return iVar4;
}

Assistant:

static idx_t Format(interval_t interval, char buffer[]) {
		idx_t length = 0;
		if (interval.months != 0) {
			int32_t years = interval.months / 12;
			int32_t months = interval.months - years * 12;
			// format the years and months
			FormatIntervalValue(years, buffer, length, " year", 5);
			FormatIntervalValue(months, buffer, length, " month", 6);
		}
		if (interval.days != 0) {
			// format the days
			FormatIntervalValue(interval.days, buffer, length, " day", 4);
		}
		if (interval.micros != 0) {
			if (length != 0) {
				// space if there is already something in the buffer
				buffer[length++] = ' ';
			}
			int64_t micros = interval.micros;
			if (micros < 0) {
				// negative time: append negative sign
				buffer[length++] = '-';
			} else {
				micros = -micros;
			}
			int64_t hour = -(micros / Interval::MICROS_PER_HOUR);
			micros += hour * Interval::MICROS_PER_HOUR;
			int64_t min = -(micros / Interval::MICROS_PER_MINUTE);
			micros += min * Interval::MICROS_PER_MINUTE;
			int64_t sec = -(micros / Interval::MICROS_PER_SEC);
			micros += sec * Interval::MICROS_PER_SEC;
			micros = -micros;

			if (hour < 10) {
				buffer[length++] = '0';
			}
			FormatSignedNumber(hour, buffer, length);
			buffer[length++] = ':';
			FormatTwoDigits(min, buffer, length);
			buffer[length++] = ':';
			FormatTwoDigits(sec, buffer, length);
			if (micros != 0) {
				buffer[length++] = '.';
				auto trailing_zeros = TimeToStringCast::FormatMicros(NumericCast<int32_t>(micros), buffer + length);
				length += NumericCast<idx_t>(6 - trailing_zeros);
			}
		} else if (length == 0) {
			// empty interval: default to 00:00:00
			memcpy(buffer, "00:00:00", 8); // NOLINT
			return 8;
		}
		return length;
	}